

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(FT_Vector *to,void *closure)

{
  bool bVar1;
  void *closure_local;
  FT_Vector *to_local;
  
  bVar1 = FTMoveto((IOutlineEnumerator *)closure,to);
  return (uint)!bVar1;
}

Assistant:

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(const FT_Vector* to, void *closure) //static
{
	return ( (FreeTypeFaceWrapper::IOutlineEnumerator *)closure )->FTMoveto(to) ? 0 : 1;
}